

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_test.cpp
# Opt level: O2

void __thiscall Container::test_CopyStaticArray::test_method(test_CopyStaticArray *this)

{
  undefined8 uVar1;
  bool bVar2;
  undefined1 **ppuVar3;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  char *local_110;
  undefined1 *local_108;
  undefined1 *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  StaticArray<unsigned_int> local_a8;
  undefined1 local_98 [8];
  StaticArray<unsigned_int> arr4;
  undefined4 local_78 [2];
  undefined8 local_70;
  shared_count sStack_68;
  undefined1 local_60 [8];
  StaticArray<unsigned_int> arr3;
  StaticArray<unsigned_int> local_40;
  
  local_40.m_Size = 4;
  local_40.m_MasPoint = (uint *)operator_new__(0x10);
  *(undefined8 *)local_40.m_MasPoint = 0x200000001;
  *(undefined8 *)((long)local_40.m_MasPoint + 8) = 0x400000003;
  arr3._8_8_ = operator_new__(4);
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/container/test/container_test.cpp"
  ;
  local_140 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_148,0x21);
  arr4.m_MasPoint._0_1_ = 0;
  local_98 = (undefined1  [8])&PTR__lazy_ostream_00109bd8;
  arr4._8_8_ = &boost::unit_test::lazy_ostream::inst;
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/container/test/container_test.cpp"
  ;
  local_120 = "";
  local_78[0] = 1;
  local_60._0_4_ = 1;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (local_98,&local_128,0x21,1,2,local_78,"arr2.size()",local_60,"1");
  cont::StaticArray<unsigned_int>::StaticArray(&local_a8,&local_40);
  uVar1 = arr3._8_8_;
  local_a8.m_Size = 1;
  arr3._8_8_ = local_a8.m_MasPoint;
  local_a8.m_MasPoint = (uint *)uVar1;
  cont::StaticArray<unsigned_int>::~StaticArray(&local_a8);
  local_118 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/container/test/container_test.cpp"
  ;
  local_110 = "";
  ppuVar3 = &local_108;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  local_100 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_118,0x24);
  bVar2 = std::__equal<true>::equal<unsigned_int>
                    ((__equal<true> *)local_40.m_MasPoint,
                     (uint *)((long)local_40.m_MasPoint + (ulong)local_40.m_Size * 4),
                     (uint *)arr3._8_8_,(uint *)ppuVar3);
  local_70 = 0;
  sStack_68.pi_ = (sp_counted_base *)0x0;
  local_60 = (undefined1  [8])0x107179;
  arr3.m_MasPoint = (uint *)0x1071b5;
  arr4.m_MasPoint._0_1_ = 0;
  local_98 = (undefined1  [8])&PTR__lazy_ostream_00109d68;
  arr4._8_8_ = &boost::unit_test::lazy_ostream::inst;
  local_f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/container/test/container_test.cpp"
  ;
  local_f0 = "";
  local_78[0]._0_1_ = bVar2;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_68);
  cont::StaticArray<unsigned_int>::StaticArray((StaticArray<unsigned_int> *)local_60,&local_40);
  local_e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/container/test/container_test.cpp"
  ;
  local_e0 = "";
  ppuVar3 = &local_d8;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e8,0x27);
  bVar2 = std::__equal<true>::equal<unsigned_int>
                    ((__equal<true> *)local_40.m_MasPoint,
                     (uint *)((long)local_40.m_MasPoint + (ulong)local_40.m_Size * 4),
                     (uint *)local_60,(uint *)ppuVar3);
  local_78[0] = CONCAT31(local_78[0]._1_3_,bVar2);
  local_70 = 0;
  sStack_68.pi_ = (sp_counted_base *)0x0;
  local_c8 = "std::equal(arr.data(), arr.data() + arr.size(), arr3.data())";
  local_c0 = "";
  arr4.m_MasPoint._0_1_ = 0;
  local_98 = (undefined1  [8])&PTR__lazy_ostream_00109d68;
  arr4._8_8_ = &boost::unit_test::lazy_ostream::inst;
  local_b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/fedyura[P]esoinn_text/src/container/test/container_test.cpp"
  ;
  local_b0 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_68);
  cont::StaticArray<unsigned_int>::StaticArray((StaticArray<unsigned_int> *)local_98,&local_40);
  cont::StaticArray<unsigned_int>::~StaticArray((StaticArray<unsigned_int> *)local_98);
  cont::StaticArray<unsigned_int>::~StaticArray((StaticArray<unsigned_int> *)local_60);
  cont::StaticArray<unsigned_int>::~StaticArray((StaticArray<unsigned_int> *)&arr3.m_Size);
  cont::StaticArray<unsigned_int>::~StaticArray(&local_40);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_CopyStaticArray)
{
    uint32_t size = 4;
    cont::StaticArray<uint32_t> arr(size);
    arr[0] = 1;
    arr[1] = 2;
    arr[2] = 3;
    arr[3] = 4;
    
    cont::StaticArray<uint32_t> arr2(1);
    BOOST_CHECK_EQUAL(arr2.size(), 1);
    
    arr2 = arr; 
    BOOST_CHECK(std::equal(arr.data(), arr.data() + arr.size(), arr2.data()));

    cont::StaticArray<uint32_t> arr3(arr);
    BOOST_CHECK(std::equal(arr.data(), arr.data() + arr.size(), arr3.data()));
    
    cont::StaticArray<uint32_t> arr4 = arr;
}